

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

double __thiscall despot::BaseRockSample::Reward(BaseRockSample *this,int s,ACT_TYPE a)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  double dVar4;
  Coord rob_pos;
  
  iVar2 = (**(code **)(*(long *)this + 0x10))();
  dVar4 = 0.0;
  if (iVar2 + -1 != s) {
    if (a < 4) {
      _rob_pos = IndexToCoord(this,s >> ((byte)this->num_rocks_ & 0x1f));
      despot::operator+=(&rob_pos,(Coord *)(&Compass::DIRECTIONS + a));
      bVar1 = Grid<int>::Inside(&this->grid_,&rob_pos);
      dVar4 = 0.0;
      if (!bVar1) {
        iVar2 = -100;
        if (_rob_pos == (this->grid_).xsize_) {
          iVar2 = 10;
        }
        dVar4 = (double)iVar2;
      }
    }
    else if (a == 4) {
      _rob_pos = IndexToCoord(this,s >> ((byte)this->num_rocks_ & 0x1f));
      puVar3 = (uint *)Grid<int>::operator()(&this->grid_,&rob_pos);
      if ((int)*puVar3 < 0) {
        dVar4 = -100.0;
      }
      else {
        dVar4 = *(double *)(&DAT_00117060 + (ulong)(((uint)s >> (*puVar3 & 0x1f) & 1) == 0) * 8);
      }
    }
  }
  return dVar4;
}

Assistant:

double BaseRockSample::Reward(int s, ACT_TYPE a) const {
	if (s == NumStates() - 1)
		return 0;

	if (a < E_SAMPLE) {
		Coord rob_pos = IndexToCoord(s >> num_rocks_);
		rob_pos += Compass::DIRECTIONS[a];
		if (grid_.Inside(rob_pos)) {
			return 0;
		} else
			return rob_pos.x == grid_.xsize() ? 10 : -100;
	} else if (a == E_SAMPLE) {
		Coord rob_pos = IndexToCoord(s >> num_rocks_);
		int rock = grid_(rob_pos);
		if (rock >= 0) {
			bool valuable = CheckFlag(s, rock);
			if (valuable)
				return 10;
			else
				return -10;
		}
		return -100;
	} else
		return 0;
}